

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

word Gia_LutComputeTruth6Simple(Gia_Man_t *p,int iPo)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  word wVar3;
  long lVar4;
  
  iVar1 = p->vCos->nSize;
  if (iVar1 - p->nRegs <= iPo) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < iPo) && (iPo < iVar1)) {
    iVar1 = p->vCos->pArray[(uint)iPo];
    lVar4 = (long)iVar1;
    if ((-1 < lVar4) && (iVar1 < p->nObjs)) {
      pGVar2 = p->pObjs;
      wVar3 = Gia_LutComputeTruth6Simple_rec(p,iVar1 - (*(uint *)(pGVar2 + lVar4) & 0x1fffffff));
      return wVar3 ^ (long)((*(int *)(pGVar2 + lVar4) << 2) >> 0x1f);
    }
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

word Gia_LutComputeTruth6Simple( Gia_Man_t * p, int iPo )
{
    Gia_Obj_t * pObj = Gia_ManPo( p, iPo );
    word Truth = Gia_LutComputeTruth6Simple_rec( p, Gia_ObjFaninId0p(p, pObj) );
    return Gia_ObjFaninC0(pObj) ? ~Truth : Truth;
}